

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void CheckStacksSize(ImGuiWindow *window,bool write)

{
  int iVar1;
  ImGuiContext *pIVar2;
  undefined7 in_register_00000031;
  
  pIVar2 = GImGui;
  iVar1 = (window->IDStack).Size;
  if ((int)CONCAT71(in_register_00000031,write) == 0) {
    if ((window->DC).StackSizesBackup[0] != iVar1) {
      __assert_fail("*p_backup == current && \"PushID/PopID or TreeNode/TreePop Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x14dc,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((window->DC).StackSizesBackup[1] != (window->DC).GroupStack.Size) {
      __assert_fail("*p_backup == current && \"BeginGroup/EndGroup Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x14dd,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((window->DC).StackSizesBackup[2] != (GImGui->CurrentPopupStack).Size) {
      __assert_fail("*p_backup == current && \"BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x14de,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((window->DC).StackSizesBackup[3] < (GImGui->ColorModifiers).Size) {
      __assert_fail("*p_backup >= current && \"PushStyleColor/PopStyleColor Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x14e0,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((window->DC).StackSizesBackup[4] < (GImGui->StyleModifiers).Size) {
      __assert_fail("*p_backup >= current && \"PushStyleVar/PopStyleVar Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x14e1,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((window->DC).StackSizesBackup[5] < (GImGui->FontStack).Size) {
      __assert_fail("*p_backup >= current && \"PushFont/PopFont Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x14e2,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
  }
  else {
    (window->DC).StackSizesBackup[0] = iVar1;
    (window->DC).StackSizesBackup[1] = (window->DC).GroupStack.Size;
    (window->DC).StackSizesBackup[2] = (pIVar2->CurrentPopupStack).Size;
    (window->DC).StackSizesBackup[3] = (pIVar2->ColorModifiers).Size;
    (window->DC).StackSizesBackup[4] = (pIVar2->StyleModifiers).Size;
    (window->DC).StackSizesBackup[5] = (pIVar2->FontStack).Size;
  }
  return;
}

Assistant:

static void CheckStacksSize(ImGuiWindow* window, bool write)
{
    // NOT checking: DC.ItemWidth, DC.AllowKeyboardFocus, DC.ButtonRepeat, DC.TextWrapPos (per window) to allow user to conveniently push once and not pop (they are cleared on Begin)
    ImGuiContext& g = *GImGui;
    int* p_backup = &window->DC.StackSizesBackup[0];
    { int current = window->IDStack.Size;       if (write) *p_backup = current; else IM_ASSERT(*p_backup == current && "PushID/PopID or TreeNode/TreePop Mismatch!");   p_backup++; }    // Too few or too many PopID()/TreePop()
    { int current = window->DC.GroupStack.Size; if (write) *p_backup = current; else IM_ASSERT(*p_backup == current && "BeginGroup/EndGroup Mismatch!");                p_backup++; }    // Too few or too many EndGroup()
    { int current = g.CurrentPopupStack.Size;   if (write) *p_backup = current; else IM_ASSERT(*p_backup == current && "BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch"); p_backup++;}// Too few or too many EndMenu()/EndPopup()
    // For color, style and font stacks there is an incentive to use Push/Begin/Pop/.../End patterns, so we relax our checks a little to allow them.
    { int current = g.ColorModifiers.Size;      if (write) *p_backup = current; else IM_ASSERT(*p_backup >= current && "PushStyleColor/PopStyleColor Mismatch!");       p_backup++; }    // Too few or too many PopStyleColor()
    { int current = g.StyleModifiers.Size;      if (write) *p_backup = current; else IM_ASSERT(*p_backup >= current && "PushStyleVar/PopStyleVar Mismatch!");           p_backup++; }    // Too few or too many PopStyleVar()
    { int current = g.FontStack.Size;           if (write) *p_backup = current; else IM_ASSERT(*p_backup >= current && "PushFont/PopFont Mismatch!");                   p_backup++; }    // Too few or too many PopFont()
    IM_ASSERT(p_backup == window->DC.StackSizesBackup + IM_ARRAYSIZE(window->DC.StackSizesBackup));
}